

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void push_scope(Context_conflict *ctx)

{
  SymbolScope *pSVar1;
  
  push_usertype(ctx,(char *)0x0,(MOJOSHADER_astDataType *)0x0);
  if (ctx->out_of_memory == 0) {
    pSVar1 = (SymbolScope *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pSVar1 == (SymbolScope *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      pSVar1->symbol = (char *)0x0;
      pSVar1->datatype = (MOJOSHADER_astDataType *)0x0;
      pSVar1->index = 0;
      pSVar1->referenced = 0;
      pSVar1->next = (ctx->variables).scope;
      (ctx->variables).scope = pSVar1;
    }
  }
  return;
}

Assistant:

static inline void push_scope(Context *ctx)
{
    push_usertype(ctx, NULL, NULL);
    push_variable(ctx, NULL, NULL);
}